

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

Type wasm::Type::getGreatestLowerBound(Type a,Type b)

{
  Type TVar1;
  bool bVar2;
  BasicHeapType BVar3;
  BasicHeapType BVar4;
  size_t sVar5;
  size_t sVar6;
  Type *pTVar7;
  Nullability nullable;
  Exactness exact;
  HeapType heapType;
  Type local_80;
  HeapType heapB;
  HeapType HStack_68;
  HeapType heapA;
  Type local_48;
  Type local_40;
  Type b_local;
  Type a_local;
  
  TVar1.id = a.id;
  if (a.id != b.id) {
    local_40.id = b.id;
    b_local.id = a.id;
    if (((a.id & 1) != 0 && 6 < a.id) && ((b.id & 1) != 0 && 6 < b.id)) {
      sVar5 = size(&b_local);
      sVar6 = size(&local_40);
      if (sVar5 == sVar6) {
        HStack_68.id = 0;
        heapA.id = 0;
        sVar5 = size(&b_local);
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffff98,sVar5
                  );
        sVar6 = 0;
        do {
          if (sVar5 == sVar6) {
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffff80,
                       (vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffff98);
            Type(&local_48,(Tuple *)&stack0xffffffffffffff80);
            std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                      ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)
                       &stack0xffffffffffffff80);
LAB_00cf9e13:
            std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                      ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)
                       &stack0xffffffffffffff98);
            return (Type)local_48.id;
          }
          pTVar7 = operator[](&b_local,sVar6);
          TVar1.id = pTVar7->id;
          pTVar7 = operator[](&local_40,sVar6);
          local_80 = getGreatestLowerBound(TVar1,pTVar7->id);
          if (local_80.id == 1) {
            local_48.id = 1;
            goto LAB_00cf9e13;
          }
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffff98,
                     &stack0xffffffffffffff80);
          sVar6 = sVar6 + 1;
        } while( true );
      }
    }
    if (((b_local.id & 1) == 0 && 6 < b_local.id) && (6 < local_40.id && (local_40.id & 1) == 0)) {
      HStack_68 = getHeapType(&b_local);
      local_80.id = (uintptr_t)getHeapType(&local_40);
      BVar3 = HeapType::getBottom(&stack0xffffffffffffff98);
      BVar4 = HeapType::getBottom((HeapType *)&stack0xffffffffffffff80);
      if (BVar3 == BVar4) {
        nullable = NonNullable;
        if (b_local.id < 7 || (b_local.id & 3) != 0) {
          nullable = (Nullability)((local_40.id & 3) != 0 || local_40.id < 7);
        }
        bVar2 = isExact(&b_local);
        if (bVar2) {
          exact = Exact;
        }
        else {
          bVar2 = isExact(&local_40);
          exact = (Exactness)bVar2;
        }
        bVar2 = HeapType::isSubType(HStack_68,(HeapType)local_80.id);
        heapType.id = HStack_68.id;
        if ((!bVar2) &&
           (bVar2 = HeapType::isSubType((HeapType)local_80.id,HStack_68), heapType.id = local_80.id,
           !bVar2)) {
          BVar3 = HeapType::getBottom(&stack0xffffffffffffff98);
          heapType.id = (uintptr_t)(ulong)BVar3;
        }
        bVar2 = isExact(&b_local);
        if (((bVar2) && (heapType.id != HStack_68.id)) ||
           ((bVar2 = isExact(&local_40), bVar2 && (heapType.id != local_80.id)))) {
          BVar3 = HeapType::getBottom(&stack0xffffffffffffff98);
          heapType.id = (uintptr_t)BVar3;
          exact = Inexact;
        }
        Type(&local_48,heapType,nullable,exact);
        return (Type)local_48.id;
      }
    }
    local_48.id = 1;
    TVar1.id = local_48.id;
  }
  local_48.id = TVar1.id;
  return (Type)local_48.id;
}

Assistant:

Type Type::getGreatestLowerBound(Type a, Type b) {
  if (a == b) {
    return a;
  }
  if (a.isTuple() && b.isTuple() && a.size() == b.size()) {
    std::vector<Type> elems;
    size_t size = a.size();
    elems.reserve(size);
    for (size_t i = 0; i < size; ++i) {
      auto glb = Type::getGreatestLowerBound(a[i], b[i]);
      if (glb == Type::unreachable) {
        return Type::unreachable;
      }
      elems.push_back(glb);
    }
    return Tuple(elems);
  }
  if (!a.isRef() || !b.isRef()) {
    return Type::unreachable;
  }
  auto heapA = a.getHeapType();
  auto heapB = b.getHeapType();
  if (heapA.getBottom() != heapB.getBottom()) {
    return Type::unreachable;
  }
  auto nullability =
    (a.isNonNullable() || b.isNonNullable()) ? NonNullable : Nullable;
  auto exactness = (a.isExact() || b.isExact()) ? Exact : Inexact;
  HeapType heapType;
  if (HeapType::isSubType(heapA, heapB)) {
    heapType = heapA;
  } else if (HeapType::isSubType(heapB, heapA)) {
    heapType = heapB;
  } else {
    heapType = heapA.getBottom();
  }
  // If one of the types is exact, but the GLB heap type is different than its
  // heap type, then we must make the GLB heap type bottom.
  if ((a.isExact() && heapType != heapA) ||
      (b.isExact() && heapType != heapB)) {
    heapType = heapA.getBottom();
    exactness = Inexact;
  }
  return Type(heapType, nullability, exactness);
}